

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall TestValueTestcompareObject::runTestCase(TestValueTestcompareObject *this)

{
  TestResult *pTVar1;
  Value *pVVar2;
  Value l2aObject;
  Value l1aObject;
  Value emptyObject;
  Value l1bObject;
  PredicateContext local_1b0;
  Value local_180;
  Value local_158;
  Value local_130;
  Value local_108;
  Value local_e0;
  Value local_b8;
  Value local_90;
  Value local_68;
  Value local_40;
  
  Json::Value::Value(&local_108,objectValue);
  Json::Value::Value(&local_130,nullValue);
  Json::Value::Value(&local_68,0);
  pVVar2 = Json::Value::operator[](&local_130,"key1");
  Json::Value::operator=(pVVar2,&local_68);
  Json::Value::~Value(&local_68);
  Json::Value::Value(&local_40,nullValue);
  Json::Value::Value(&local_90,10);
  pVVar2 = Json::Value::operator[](&local_130,"key1");
  Json::Value::operator=(pVVar2,&local_90);
  Json::Value::~Value(&local_90);
  Json::Value::Value(&local_158,nullValue);
  Json::Value::Value(&local_b8,0);
  pVVar2 = Json::Value::operator[](&local_158,"key1");
  Json::Value::operator=(pVVar2,&local_b8);
  Json::Value::~Value(&local_b8);
  Json::Value::Value(&local_e0,0);
  pVVar2 = Json::Value::operator[](&local_158,"key2");
  Json::Value::operator=(pVVar2,&local_e0);
  Json::Value::~Value(&local_e0);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_1b0.id_ = pTVar1->predicateId_;
  local_1b0.file_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_1b0.line_ = 0x568;
  local_1b0.expr_ = "checkIsLess(emptyObject, l1aObject)";
  local_1b0.next_ = (PredicateContext *)0x0;
  local_1b0.failure_ = (Failure *)0x0;
  pTVar1->predicateStackTail_->next_ = &local_1b0;
  pTVar1->predicateId_ = local_1b0.id_ + 1;
  pTVar1->predicateStackTail_ = &local_1b0;
  ValueTest::checkIsLess(&this->super_ValueTest,&local_108,&local_130);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_1b0.id_ = pTVar1->predicateId_;
  local_1b0.file_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_1b0.line_ = 0x569;
  local_1b0.expr_ = "checkIsLess(emptyObject, l2aObject)";
  local_1b0.next_ = (PredicateContext *)0x0;
  local_1b0.failure_ = (Failure *)0x0;
  pTVar1->predicateStackTail_->next_ = &local_1b0;
  pTVar1->predicateId_ = local_1b0.id_ + 1;
  pTVar1->predicateStackTail_ = &local_1b0;
  ValueTest::checkIsLess(&this->super_ValueTest,&local_108,&local_158);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_1b0.id_ = pTVar1->predicateId_;
  local_1b0.file_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_1b0.line_ = 0x56a;
  local_1b0.expr_ = "checkIsLess(l1aObject, l2aObject)";
  local_1b0.next_ = (PredicateContext *)0x0;
  local_1b0.failure_ = (Failure *)0x0;
  pTVar1->predicateStackTail_->next_ = &local_1b0;
  pTVar1->predicateId_ = local_1b0.id_ + 1;
  pTVar1->predicateStackTail_ = &local_1b0;
  ValueTest::checkIsLess(&this->super_ValueTest,&local_130,&local_158);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_1b0.id_ = pTVar1->predicateId_;
  local_1b0.file_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_1b0.line_ = 0x56b;
  local_1b0.expr_ = "checkIsEqual(emptyObject, Json::Value(emptyObject))";
  local_1b0.next_ = (PredicateContext *)0x0;
  local_1b0.failure_ = (Failure *)0x0;
  pTVar1->predicateStackTail_->next_ = &local_1b0;
  pTVar1->predicateId_ = local_1b0.id_ + 1;
  pTVar1->predicateStackTail_ = &local_1b0;
  Json::Value::Value(&local_180,&local_108);
  ValueTest::checkIsEqual(&this->super_ValueTest,&local_108,&local_180);
  Json::Value::~Value(&local_180);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_1b0.id_ = pTVar1->predicateId_;
  local_1b0.file_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_1b0.line_ = 0x56c;
  local_1b0.expr_ = "checkIsEqual(l1aObject, Json::Value(l1aObject))";
  local_1b0.next_ = (PredicateContext *)0x0;
  local_1b0.failure_ = (Failure *)0x0;
  pTVar1->predicateStackTail_->next_ = &local_1b0;
  pTVar1->predicateId_ = local_1b0.id_ + 1;
  pTVar1->predicateStackTail_ = &local_1b0;
  Json::Value::Value(&local_180,&local_130);
  ValueTest::checkIsEqual(&this->super_ValueTest,&local_130,&local_180);
  Json::Value::~Value(&local_180);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_1b0.id_ = pTVar1->predicateId_;
  local_1b0.file_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_1b0.line_ = 0x56d;
  local_1b0.expr_ = "checkIsEqual(l2aObject, Json::Value(l2aObject))";
  local_1b0.next_ = (PredicateContext *)0x0;
  local_1b0.failure_ = (Failure *)0x0;
  pTVar1->predicateStackTail_->next_ = &local_1b0;
  pTVar1->predicateId_ = local_1b0.id_ + 1;
  pTVar1->predicateStackTail_ = &local_1b0;
  Json::Value::Value(&local_180,&local_158);
  ValueTest::checkIsEqual(&this->super_ValueTest,&local_158,&local_180);
  Json::Value::~Value(&local_180);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  Json::Value::~Value(&local_158);
  Json::Value::~Value(&local_40);
  Json::Value::~Value(&local_130);
  Json::Value::~Value(&local_108);
  return;
}

Assistant:

JSONTEST_FIXTURE(ValueTest, compareObject) {
  // object compare size then content
  Json::Value emptyObject(Json::objectValue);
  Json::Value l1aObject;
  l1aObject["key1"] = 0;
  Json::Value l1bObject;
  l1aObject["key1"] = 10;
  Json::Value l2aObject;
  l2aObject["key1"] = 0;
  l2aObject["key2"] = 0;
  JSONTEST_ASSERT_PRED(checkIsLess(emptyObject, l1aObject));
  JSONTEST_ASSERT_PRED(checkIsLess(emptyObject, l2aObject));
  JSONTEST_ASSERT_PRED(checkIsLess(l1aObject, l2aObject));
  JSONTEST_ASSERT_PRED(checkIsEqual(emptyObject, Json::Value(emptyObject)));
  JSONTEST_ASSERT_PRED(checkIsEqual(l1aObject, Json::Value(l1aObject)));
  JSONTEST_ASSERT_PRED(checkIsEqual(l2aObject, Json::Value(l2aObject)));
}